

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O0

void proto2_unittest::TestProto3Optional::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestProto3Optional *pTVar2;
  string *psVar3;
  int32_t iVar4;
  TestProto3Optional **v1;
  TestProto3Optional **v2;
  char *failure_msg;
  LogMessage *pLVar5;
  uint32_t *puVar6;
  Arena *pAVar7;
  TestProto3Optional_NestedMessage *pTVar8;
  int64_t iVar9;
  LogMessage local_100;
  Voidify local_ea;
  byte local_e9;
  LogMessage local_e8;
  Voidify local_d1;
  uint local_d0;
  uint32_t cached_has_bits;
  LogMessage local_c0;
  Voidify local_a9;
  TestProto3Optional *local_a8;
  Nullable<const_char_*> local_a0;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestProto3Optional *from;
  TestProto3Optional *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_68;
  __pointer_type local_60;
  Nullable<const_char_*> local_58;
  string *local_50;
  TestProto3Optional *local_48;
  anon_union_144_1_493b367e_for_TestProto3Optional_12 *local_40;
  string *local_38;
  TestProto3Optional *local_30;
  anon_union_144_1_493b367e_for_TestProto3Optional_12 *local_28;
  string *local_20;
  TestProto3Optional *local_18;
  anon_union_144_1_493b367e_for_TestProto3Optional_12 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestProto3Optional *)to_msg;
  _this = (TestProto3Optional *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_a8 = (TestProto3Optional *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestProto3Optional_const*>(&local_a8);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::TestProto3Optional*>
                 (&from);
  local_a0 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestProto3Optional_const*,proto2_unittest::TestProto3Optional*>
                       (v1,v2,"&from != _this");
  if (local_a0 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_a0);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_optional.pb.cc"
               ,0x4ba,failure_msg);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_c0);
  }
  local_d0 = 0;
  puVar6 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pTVar2 = from;
  local_d0 = *puVar6;
  if ((local_d0 & 0xff) != 0) {
    if ((local_d0 & 1) != 0) {
      local_50 = _internal_optional_string_abi_cxx11_((TestProto3Optional *)arena);
      local_48 = pTVar2;
      local_40 = &pTVar2->field_0;
      puVar6 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_50;
      *puVar6 = *puVar6 | 1;
      pAVar7 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.optional_string_,psVar3,pAVar7);
    }
    pTVar2 = from;
    if ((local_d0 & 2) != 0) {
      local_38 = _internal_optional_bytes_abi_cxx11_((TestProto3Optional *)arena);
      local_30 = pTVar2;
      local_28 = &pTVar2->field_0;
      puVar6 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_38;
      *puVar6 = *puVar6 | 2;
      pAVar7 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.optional_bytes_,psVar3,pAVar7);
    }
    pTVar2 = from;
    if ((local_d0 & 4) != 0) {
      local_20 = _internal_optional_cord_abi_cxx11_((TestProto3Optional *)arena);
      local_18 = pTVar2;
      local_10 = &pTVar2->field_0;
      puVar6 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_20;
      *puVar6 = *puVar6 | 4;
      pAVar7 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.optional_cord_,psVar3,pAVar7);
    }
    if ((local_d0 & 8) != 0) {
      local_e9 = 0;
      if ((arena->impl_).first_arena_.ptr_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_optional.pb.cc"
                   ,0x4ca,"from._impl_.optional_nested_message_ != nullptr");
        local_e9 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_d1,pLVar5);
      }
      if ((local_e9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e8);
      }
      if ((from->field_0)._impl_.optional_nested_message_ == (TestProto3Optional_NestedMessage *)0x0
         ) {
        local_60 = (arena->impl_).first_arena_.ptr_._M_b._M_p;
        local_58 = absl_log_internal_check_op_result;
        pTVar8 = (TestProto3Optional_NestedMessage *)
                 google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestProto3Optional_NestedMessage>
                           ((Arena *)absl_log_internal_check_op_result,local_60);
        (from->field_0)._impl_.optional_nested_message_ = pTVar8;
      }
      else {
        TestProto3Optional_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_nested_message_,
                   (TestProto3Optional_NestedMessage *)(arena->impl_).first_arena_.ptr_._M_b._M_p);
      }
    }
    if ((local_d0 & 0x10) != 0) {
      if ((arena->impl_).first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_optional.pb.cc"
                   ,0x4d2,"from._impl_.lazy_nested_message_ != nullptr");
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_100);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_ea,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_100);
      }
      if ((from->field_0)._impl_.lazy_nested_message_ == (TestProto3Optional_NestedMessage *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.limit_;
        local_68 = absl_log_internal_check_op_result;
        pTVar8 = (TestProto3Optional_NestedMessage *)
                 google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestProto3Optional_NestedMessage>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.lazy_nested_message_ = pTVar8;
      }
      else {
        TestProto3Optional_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.lazy_nested_message_,
                   (TestProto3Optional_NestedMessage *)(arena->impl_).first_arena_.limit_);
      }
    }
    if ((local_d0 & 0x20) != 0) {
      (from->field_0)._impl_.optional_int64_ = (int64_t)(arena->impl_).first_arena_.prefetch_ptr_;
    }
    if ((local_d0 & 0x40) != 0) {
      (from->field_0)._impl_.optional_int32_ =
           *(int32_t *)&(arena->impl_).first_arena_.cleanup_list_.head_;
    }
    if ((local_d0 & 0x80) != 0) {
      (from->field_0)._impl_.optional_uint32_ =
           *(uint32_t *)((long)&(arena->impl_).first_arena_.cleanup_list_.head_ + 4);
    }
  }
  if ((local_d0 & 0xff00) != 0) {
    if ((local_d0 & 0x100) != 0) {
      (from->field_0)._impl_.optional_uint64_ =
           (uint64_t)(arena->impl_).first_arena_.cleanup_list_.next_;
    }
    if ((local_d0 & 0x200) != 0) {
      (from->field_0)._impl_.optional_sint64_ =
           (int64_t)(arena->impl_).first_arena_.cleanup_list_.limit_;
    }
    if ((local_d0 & 0x400) != 0) {
      (from->field_0)._impl_.optional_sint32_ =
           *(int32_t *)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_;
    }
    if ((local_d0 & 0x800) != 0) {
      (from->field_0)._impl_.optional_fixed32_ =
           *(uint32_t *)((long)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ + 4);
    }
    if ((local_d0 & 0x1000) != 0) {
      *(__pointer_type *)((long)&from->field_0 + 0x58) =
           (arena->impl_).first_arena_.string_block_._M_b._M_p;
    }
    if ((local_d0 & 0x2000) != 0) {
      *(__int_type_conflict2 *)((long)&from->field_0 + 0x60) =
           (arena->impl_).first_arena_.string_block_unused_.super___atomic_base<unsigned_long>._M_i;
    }
    if ((local_d0 & 0x4000) != 0) {
      (from->field_0)._impl_.optional_sfixed32_ =
           *(int32_t *)&(arena->impl_).first_arena_.head_._M_b._M_p;
    }
    if ((local_d0 & 0x8000) != 0) {
      (from->field_0)._impl_.optional_float_ =
           *(float *)((long)&(arena->impl_).first_arena_.head_._M_b._M_p + 4);
    }
  }
  if ((local_d0 & 0x1f0000) != 0) {
    if ((local_d0 & 0x10000) != 0) {
      *(__int_type_conflict2 *)((long)&from->field_0 + 0x70) =
           (arena->impl_).first_arena_.space_used_.super___atomic_base<unsigned_long>._M_i;
    }
    if ((local_d0 & 0x20000) != 0) {
      (from->field_0)._impl_.optional_bool_ =
           (bool)((byte)(arena->impl_).first_arena_.space_allocated_.
                        super___atomic_base<unsigned_long>._M_i & 1);
    }
    if ((local_d0 & 0x40000) != 0) {
      (from->field_0)._impl_.optional_nested_enum_ =
           *(int *)((long)&(arena->impl_).first_arena_.space_allocated_.
                           super___atomic_base<unsigned_long>._M_i + 4);
    }
    if (((local_d0 & 0x80000) != 0) &&
       (iVar9 = _internal_singular_int64((TestProto3Optional *)arena), iVar9 != 0)) {
      (from->field_0)._impl_.singular_int64_ = (int64_t)(arena->impl_).first_arena_.parent_;
    }
    if (((local_d0 & 0x100000) != 0) &&
       (iVar4 = _internal_singular_int32((TestProto3Optional *)arena), iVar4 != 0)) {
      (from->field_0)._impl_.singular_int32_ =
           *(int32_t *)&(arena->impl_).first_arena_.cached_block_length_;
    }
  }
  uVar1 = local_d0;
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar6 = uVar1 | *puVar6;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestProto3Optional::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestProto3Optional*>(&to_msg);
  auto& from = static_cast<const TestProto3Optional&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestProto3Optional)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_optional_cord(from._internal_optional_cord());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.lazy_nested_message_ != nullptr);
      if (_this->_impl_.lazy_nested_message_ == nullptr) {
        _this->_impl_.lazy_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.lazy_nested_message_);
      } else {
        _this->_impl_.lazy_nested_message_->MergeFrom(*from._impl_.lazy_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.optional_float_ = from._impl_.optional_float_;
    }
  }
  if ((cached_has_bits & 0x001f0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.optional_double_ = from._impl_.optional_double_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_singular_int64() != 0) {
        _this->_impl_.singular_int64_ = from._impl_.singular_int64_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_singular_int32() != 0) {
        _this->_impl_.singular_int32_ = from._impl_.singular_int32_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}